

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O0

Vec_Int_t * Abc_NtkRetimeInitialValues(Abc_Ntk_t *pNtkCone,Vec_Int_t *vValues,int fVerbose)

{
  int *pArray;
  uint uVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  abctime aVar4;
  abctime aVar5;
  Abc_Ntk_t *local_58;
  abctime clk;
  int RetValue;
  Abc_Ntk_t *pNtkLogic;
  Abc_Ntk_t *pNtkMiter;
  Vec_Int_t *vSolution;
  int fVerbose_local;
  Vec_Int_t *vValues_local;
  Abc_Ntk_t *pNtkCone_local;
  
  if (pNtkCone == (Abc_Ntk_t *)0x0) {
    pNtkCone_local = (Abc_Ntk_t *)Vec_IntDup(vValues);
  }
  else {
    pNtk = Abc_NtkDup(pNtkCone);
    Abc_NtkToAig(pNtk);
    pNtk_00 = Abc_NtkCreateTarget(pNtk,pNtk->vCos,vValues);
    if (fVerbose != 0) {
      uVar1 = Abc_NtkNodeNum(pNtk_00);
      printf("The miter for initial state computation has %d AIG nodes. ",(ulong)uVar1);
    }
    aVar4 = Abc_Clock();
    iVar2 = Abc_NtkMiterSat(pNtk_00,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    if (fVerbose != 0) {
      Abc_Print(1,"%s =","SAT solving time");
      aVar5 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
    }
    if (iVar2 == 1) {
      printf(
            "Abc_NtkRetimeInitialValues(): The problem is unsatisfiable. DC latch values are used.\n"
            );
    }
    else if (iVar2 == -1) {
      printf("Abc_NtkRetimeInitialValues(): The SAT problem timed out. DC latch values are used.\n")
      ;
    }
    else {
      iVar3 = Abc_NtkRetimeVerifyModel(pNtkCone,vValues,pNtk_00->pModel);
      if (iVar3 == 0) {
        printf("Abc_NtkRetimeInitialValues(): The computed counter-example is incorrect.\n");
      }
    }
    if (iVar2 == 0) {
      pArray = pNtk_00->pModel;
      iVar2 = Abc_NtkPiNum(pNtk);
      local_58 = (Abc_Ntk_t *)Vec_IntAllocArray(pArray,iVar2);
    }
    else {
      local_58 = (Abc_Ntk_t *)0x0;
    }
    pNtk_00->pModel = (int *)0x0;
    Abc_NtkDelete(pNtk_00);
    Abc_NtkDelete(pNtk);
    pNtkCone_local = local_58;
  }
  return (Vec_Int_t *)pNtkCone_local;
}

Assistant:

Vec_Int_t * Abc_NtkRetimeInitialValues( Abc_Ntk_t * pNtkCone, Vec_Int_t * vValues, int fVerbose )
{
    Vec_Int_t * vSolution;
    Abc_Ntk_t * pNtkMiter, * pNtkLogic;
    int RetValue;
    abctime clk;
    if ( pNtkCone == NULL )
        return Vec_IntDup( vValues );
    // convert the target network to AIG
    pNtkLogic = Abc_NtkDup( pNtkCone );
    Abc_NtkToAig( pNtkLogic );
    // get the miter
    pNtkMiter = Abc_NtkCreateTarget( pNtkLogic, pNtkLogic->vCos, vValues );
    if ( fVerbose )
        printf( "The miter for initial state computation has %d AIG nodes. ", Abc_NtkNodeNum(pNtkMiter) );
    // solve the miter
    clk = Abc_Clock();
    RetValue = Abc_NtkMiterSat( pNtkMiter, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );
    if ( fVerbose ) 
        { ABC_PRT( "SAT solving time", Abc_Clock() - clk ); }
    // analyze the result
    if ( RetValue == 1 )
        printf( "Abc_NtkRetimeInitialValues(): The problem is unsatisfiable. DC latch values are used.\n" );
    else if ( RetValue == -1 )
        printf( "Abc_NtkRetimeInitialValues(): The SAT problem timed out. DC latch values are used.\n" );
    else if ( !Abc_NtkRetimeVerifyModel( pNtkCone, vValues, pNtkMiter->pModel ) )
        printf( "Abc_NtkRetimeInitialValues(): The computed counter-example is incorrect.\n" );
    // set the values of the latches
    vSolution = RetValue? NULL : Vec_IntAllocArray( pNtkMiter->pModel, Abc_NtkPiNum(pNtkLogic) );
    pNtkMiter->pModel = NULL;
    Abc_NtkDelete( pNtkMiter );
    Abc_NtkDelete( pNtkLogic );
    return vSolution;
}